

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

void __thiscall MotionBase::MotionBase(MotionBase *this,MotionBase *prevMotion)

{
  double dVar1;
  
  this->_vptr_MotionBase = (_func_int **)&PTR__MotionBase_001262f0;
  this->accel = 0.0;
  if (prevMotion == (MotionBase *)0x0) {
    this->t0 = 0.0;
    this->p0 = 0.0;
    dVar1 = 0.0;
  }
  else {
    this->t0 = prevMotion->tf;
    this->p0 = prevMotion->pf;
    dVar1 = prevMotion->vf;
  }
  this->v0 = dVar1;
  this->tf = this->t0;
  this->pf = this->p0;
  this->vf = dVar1;
  return;
}

Assistant:

MotionBase::MotionBase(const MotionBase *prevMotion) : accel(0.0)
{
    if (prevMotion) {
        t0 = prevMotion->tf;
        p0 = prevMotion->pf;
        v0 = prevMotion->vf;
    }
    else {
        t0 = 0.0;
        p0 = 0.0;
        v0 = 0.0;
    }
    // Derived classes should override these default values.
    // Note that (tf == t0) is used to indicate an error.
    tf = t0;
    pf = p0;
    vf = v0;
}